

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O1

void printUnsignedImm8(MCInst *MI,int opNum,SStream *O)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  cs_detail *pcVar3;
  char *pcVar4;
  _Bool _Var5;
  MCOperand *op;
  ulong uVar6;
  
  op = MCInst_getOperand(MI,opNum);
  _Var5 = MCOperand_isImm(op);
  if (_Var5) {
    uVar6 = MCOperand_getImm(op);
    pcVar4 = ", %u";
    if (9 < ((uint)uVar6 & 0xff)) {
      pcVar4 = ", 0x%x";
    }
    SStream_concat(O,pcVar4 + 2);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      puVar2 = pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x18 + 0x16;
      puVar2[0] = '\x02';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      pcVar3 = MI->flat_insn->detail;
      *(ulong *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x18 + 0x1e) =
           uVar6 & 0xff;
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
    return;
  }
  printOperand(MI,opNum,O);
  return;
}

Assistant:

static void printUnsignedImm8(MCInst *MI, int opNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, opNum);
	if (MCOperand_isImm(MO)) {
		uint8_t imm = (uint8_t)MCOperand_getImm(MO);
		if (imm > HEX_THRESHOLD)
			SStream_concat(O, "0x%x", imm);
		else
			SStream_concat(O, "%u", imm);
		if (MI->csh->detail) {
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_IMM;
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].imm = imm;
			MI->flat_insn->detail->mips.op_count++;
		}
	} else
		printOperand(MI, opNum, O);
}